

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

void getPeerArrays(int MySize,int MyRank,int PeerSize,int **forwardArray,int **reverseArray)

{
  int iVar1;
  int *piVar2;
  int *__ptr;
  int *__ptr_00;
  int MyRank_00;
  int iVar3;
  long lVar4;
  
  if (MySize < PeerSize) {
    piVar2 = PeerArray(MySize,MyRank,PeerSize);
    *forwardArray = piVar2;
    if (reverseArray != (int **)0x0) {
      piVar2 = (int *)malloc(8);
      *reverseArray = piVar2;
      *piVar2 = **forwardArray;
      piVar2[1] = -1;
    }
  }
  else {
    piVar2 = (int *)malloc(8);
    *forwardArray = piVar2;
    piVar2[1] = -1;
    __ptr = (int *)malloc(4);
    *piVar2 = -1;
    MyRank_00 = 0;
    iVar1 = 0;
    if (0 < PeerSize) {
      iVar1 = PeerSize;
    }
    iVar3 = 0;
    for (; MyRank_00 != iVar1; MyRank_00 = MyRank_00 + 1) {
      __ptr_00 = PeerArray(PeerSize,MyRank_00,MySize);
      for (lVar4 = 0; *(int *)((long)__ptr_00 + lVar4) != -1; lVar4 = lVar4 + 4) {
        if (*(int *)((long)__ptr_00 + lVar4) == MyRank) {
          __ptr = (int *)realloc(__ptr,(long)iVar3 * 4 + 8);
          __ptr[iVar3] = MyRank_00;
          iVar3 = iVar3 + 1;
          if (lVar4 == 0) {
            *piVar2 = MyRank_00;
          }
        }
      }
      free(__ptr_00);
    }
    __ptr[iVar3] = -1;
    if (reverseArray == (int **)0x0) {
      free(__ptr);
      return;
    }
    *reverseArray = __ptr;
  }
  return;
}

Assistant:

extern void getPeerArrays(int MySize, int MyRank, int PeerSize, int **forwardArray,
                          int **reverseArray)
{
    if (MySize < PeerSize)
    {
        /* more of them than me.  I will have at least one entry in my forward
         * array. */
        *forwardArray = PeerArray(MySize, MyRank, PeerSize);
        /* all need to be notified, but I'm only the forward peer to one of them
         * (the first), so send reverse peer entry only to zeroth entry */
        if (reverseArray)
        {
            *reverseArray = malloc(sizeof(int) * 2);
            (*reverseArray)[0] = (*forwardArray)[0];
            (*reverseArray)[1] = -1;
        }
    }
    else
    {
        /* More of me than of them, there may be 0 or 1 entries in my forward
         * array, but there must be one opposing peer that I should notify so
         * that I am in his forward array */
        int *reverse;
        *forwardArray = malloc(sizeof(int) * 2);
        (*forwardArray)[1] = -1;
        reverse = reversePeerArray(MySize, MyRank, PeerSize, &((*forwardArray)[0]));
        if (reverseArray)
        {
            *reverseArray = reverse;
        }
        else
        {
            free(reverse);
        }
    }
}